

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

cmSourcesWithOutput * __thiscall
cmLocalGenerator::GetSourcesWithOutput
          (cmSourcesWithOutput *__return_storage_ptr__,cmLocalGenerator *this,string *name)

{
  bool bVar1;
  const_iterator cVar2;
  cmTarget *pcVar3;
  cmSourceFile *pcVar4;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(name);
  if (bVar1) {
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->OutputToSource)._M_h,name);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
        ._M_cur == (__node_type *)0x0) {
      __return_storage_ptr__->Target = (cmTarget *)0x0;
      __return_storage_ptr__->Source = (cmSourceFile *)0x0;
      __return_storage_ptr__->SourceIsByproduct = false;
    }
    else {
      *(undefined8 *)&__return_storage_ptr__->SourceIsByproduct =
           *(undefined8 *)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
                   ._M_cur + 0x38);
      pcVar4 = *(cmSourceFile **)
                ((long)cVar2.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
                       ._M_cur + 0x30);
      __return_storage_ptr__->Target =
           *(cmTarget **)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator::SourceEntry>,_true>
                   ._M_cur + 0x28);
      __return_storage_ptr__->Source = pcVar4;
    }
  }
  else {
    __return_storage_ptr__->SourceIsByproduct = false;
    pcVar3 = LinearGetTargetWithOutput(this,name);
    __return_storage_ptr__->Target = pcVar3;
    pcVar4 = LinearGetSourceFileWithOutput
                       (this,name,OutputOrByproduct,&__return_storage_ptr__->SourceIsByproduct);
    __return_storage_ptr__->Source = pcVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

cmSourcesWithOutput cmLocalGenerator::GetSourcesWithOutput(
  const std::string& name) const
{
  // Linear search?  Also see GetSourceFileWithOutput for detail.
  if (!cmSystemTools::FileIsFullPath(name)) {
    cmSourcesWithOutput sources;
    sources.Target = this->LinearGetTargetWithOutput(name);
    sources.Source = this->LinearGetSourceFileWithOutput(
      name, cmSourceOutputKind::OutputOrByproduct, sources.SourceIsByproduct);
    return sources;
  }
  // Otherwise we use an efficient lookup map.
  auto o = this->OutputToSource.find(name);
  if (o != this->OutputToSource.end()) {
    return o->second.Sources;
  }
  return {};
}